

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileToString.cpp
# Opt level: O0

ComparisonStatusFlags __thiscall
Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::FileToString>::operator()
          (Comparator<Corrade::TestSuite::Compare::FileToString> *this,StringView filename,
          StringView expectedContents)

{
  bool bVar1;
  byte bVar2;
  State *pSVar3;
  type *this_00;
  undefined1 local_a0 [40];
  undefined4 local_78;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined1 local_58 [8];
  Optional<Corrade::Containers::String> actualContents;
  Comparator<Corrade::TestSuite::Compare::FileToString> *this_local;
  StringView expectedContents_local;
  StringView filename_local;
  
  filename_local._data = (char *)filename._sizePlusFlags;
  actualContents._24_8_ = this;
  pSVar3 = Containers::
           Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::FileToString>::State>
           ::operator->(&this->_state);
  (pSVar3->filename)._data = filename._data;
  (pSVar3->filename)._sizePlusFlags = (size_t)filename_local._data;
  expectedContents_local._sizePlusFlags._0_4_ = filename._data._0_4_;
  expectedContents_local._sizePlusFlags._4_4_ = filename._data._4_4_;
  local_68 = (undefined4)expectedContents_local._sizePlusFlags;
  uStack_64 = expectedContents_local._sizePlusFlags._4_4_;
  uStack_60 = filename_local._data._0_4_;
  uStack_5c = filename_local._data._4_4_;
  Corrade::Utility::Path::readString((Optional *)local_58,filename._data,filename_local._data);
  bVar1 = Containers::Optional::operator_cast_to_bool((Optional *)local_58);
  if (bVar1) {
    this_00 = Utility::move<Corrade::Containers::Optional<Corrade::Containers::String>&>
                        ((Optional<Corrade::Containers::String> *)local_58);
    Containers::Optional<Corrade::Containers::String>::operator*
              ((String *)(local_a0 + 0x10),this_00);
    pSVar3 = Containers::
             Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::FileToString>::State>
             ::operator->(&this->_state);
    Corrade::Containers::String::operator=(&pSVar3->actualContents,(String *)(local_a0 + 0x10));
    Corrade::Containers::String::~String((String *)(local_a0 + 0x10));
    pSVar3 = Containers::
             Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::FileToString>::State>
             ::operator->(&this->_state);
    (pSVar3->expectedContents)._data = expectedContents._data;
    (pSVar3->expectedContents)._sizePlusFlags = expectedContents._sizePlusFlags;
    pSVar3 = Containers::
             Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::FileToString>::State>
             ::operator->(&this->_state);
    pSVar3->result = Success;
    Containers::
    Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::FileToString>::State>::
    operator->(&this->_state);
    Corrade::Containers::BasicStringView<char_const>::BasicStringView((String *)local_a0);
    bVar2 = Corrade::Containers::operator==
                      (local_a0._0_8_,local_a0._8_8_,expectedContents._data,
                       expectedContents._sizePlusFlags);
    if ((bVar2 & 1) == 0) {
      Containers::EnumSet<Corrade::TestSuite::ComparisonStatusFlag,_(unsigned_char)'\xff'>::EnumSet
                ((EnumSet<Corrade::TestSuite::ComparisonStatusFlag,_(unsigned_char)__xff_> *)
                 ((long)&filename_local._sizePlusFlags + 7),Failed);
    }
    else {
      Containers::EnumSet<Corrade::TestSuite::ComparisonStatusFlag,_(unsigned_char)'\xff'>::EnumSet
                ((EnumSet<Corrade::TestSuite::ComparisonStatusFlag,_(unsigned_char)__xff_> *)
                 ((long)&filename_local._sizePlusFlags + 7));
    }
  }
  else {
    Containers::EnumSet<Corrade::TestSuite::ComparisonStatusFlag,_(unsigned_char)'\xff'>::EnumSet
              ((EnumSet<Corrade::TestSuite::ComparisonStatusFlag,_(unsigned_char)__xff_> *)
               ((long)&filename_local._sizePlusFlags + 7),Failed);
  }
  local_78 = 1;
  Containers::Optional<Corrade::Containers::String>::~Optional
            ((Optional<Corrade::Containers::String> *)local_58);
  return (ComparisonStatusFlags)filename_local._sizePlusFlags._7_1_;
}

Assistant:

ComparisonStatusFlags Comparator<Compare::FileToString>::operator()(const Containers::StringView filename, const Containers::StringView expectedContents) {
    _state->filename = filename;

    Containers::Optional<Containers::String> actualContents = Utility::Path::readString(filename);
    if(!actualContents)
        return ComparisonStatusFlag::Failed;

    _state->actualContents = *Utility::move(actualContents);
    _state->expectedContents = expectedContents;
    _state->result = Result::Success;

    return _state->actualContents == expectedContents ? ComparisonStatusFlags{} :
        ComparisonStatusFlag::Failed;
}